

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

Excluded s2pred::GetVoronoiSiteExclusion
                   (S2Point *a,S2Point *b,S2Point *x0,S2Point *x1,S1ChordAngle r)

{
  double dVar1;
  long lVar2;
  int iVar3;
  Excluded EVar4;
  long lVar5;
  double *ap;
  bool bVar6;
  S1ChordAngle local_130;
  undefined1 local_128 [16];
  longdouble local_118;
  longdouble local_108;
  double local_f0;
  ExactFloat local_e8;
  Vector3_xf local_d8;
  Vector3_xf local_a8;
  Vector3_xf local_78;
  S2LogMessage local_40;
  
  local_130.length2_ = r.length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_128,2.0);
  if ((double)local_128._0_8_ <= local_130.length2_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT62(local_128._10_6_,local_128._8_2_),
               "Check failed: (r) < (S1ChordAngle::Right()) ",0x2c);
  }
  else {
    iVar3 = CompareDistances(x0,a,b);
    if (iVar3 < 0) {
      iVar3 = CompareEdgeDistance(a,x0,x1,local_130);
      if (iVar3 < 1) {
        iVar3 = CompareEdgeDistance(b,x0,x1,local_130);
        if (iVar3 < 1) {
          local_128._0_8_ = -x1->c_[0];
          local_128._10_6_ = (uint6)((ulong)x1->c_[1] >> 0x10) ^ 0x800000000000;
          local_128._8_2_ = SUB82(x1->c_[1],0);
          local_118 = (longdouble)CONCAT28(local_118._8_2_,-x1->c_[2]);
          if ((x0->c_[0] != (double)local_128._0_8_) ||
             (NAN(x0->c_[0]) || NAN((double)local_128._0_8_))) {
            bVar6 = true;
          }
          else {
            lVar5 = 0;
            do {
              bVar6 = lVar5 == 0x10;
              if (bVar6) goto LAB_0021b05c;
              dVar1 = *(double *)((long)x0->c_ + lVar5 + 8);
              lVar2 = lVar5 + 8;
              lVar5 = lVar5 + 8;
            } while ((dVar1 == *(double *)(local_128 + lVar2)) &&
                    (!NAN(dVar1) && !NAN(*(double *)(local_128 + lVar2))));
            bVar6 = false;
LAB_0021b05c:
            bVar6 = (bool)(bVar6 ^ 1);
          }
          if (bVar6) {
            iVar3 = CompareDistances(x1,a,b);
            if (iVar3 < 0) {
              EVar4 = SECOND;
            }
            else {
              EVar4 = TriageVoronoiSiteExclusion<double>(a,b,x0,x1,local_130.length2_);
              if (EVar4 == UNCERTAIN) {
                local_118 = (longdouble)a->c_[1];
                local_108 = (longdouble)a->c_[2];
                local_128._0_8_ = SUB108((longdouble)a->c_[0],0);
                local_128._8_2_ = (undefined2)((unkuint10)(longdouble)a->c_[0] >> 0x40);
                local_78.c_[0]._0_10_ = (BADTYPE)b->c_[0];
                local_78.c_[1]._0_10_ = (BADTYPE)b->c_[1];
                local_78.c_[2]._0_10_ = (BADTYPE)b->c_[2];
                local_a8.c_[0]._0_10_ = (BADTYPE)x0->c_[0];
                local_a8.c_[1]._0_10_ = (BADTYPE)x0->c_[1];
                local_a8.c_[2]._0_10_ = (BADTYPE)x0->c_[2];
                local_d8.c_[0]._0_10_ = (BADTYPE)x1->c_[0];
                local_d8.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
                local_d8.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
                local_f0 = local_130.length2_;
                EVar4 = TriageVoronoiSiteExclusion<long_double>
                                  ((Vector3<long_double> *)local_128,
                                   (Vector3<long_double> *)&local_78,
                                   (Vector3<long_double> *)&local_a8,
                                   (Vector3<long_double> *)&local_d8,(longdouble)local_130.length2_)
                ;
                if (EVar4 == UNCERTAIN) {
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (local_128,(BasicVector<Vector3,ExactFloat,3ul> *)a);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_78,(BasicVector<Vector3,ExactFloat,3ul> *)b);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_a8,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_d8,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
                  ExactFloat::ExactFloat(&local_e8,local_130.length2_);
                  EVar4 = ExactVoronoiSiteExclusion
                                    ((Vector3_xf *)local_128,&local_78,&local_a8,&local_d8,&local_e8
                                    );
                  BN_free((BIGNUM *)local_e8.bn_.bn_);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)local_d8.c_ + lVar5 + -8));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_d8.c_[2].bn_.bn_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_a8.c_[2].bn_.bn_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_130.length2_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                }
              }
            }
            return EVar4;
          }
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x571,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: (x0) != (-x1) ",0x1c);
        }
        else {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_128,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x56e,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)CONCAT62(local_128._10_6_,local_128._8_2_),
                     "Check failed: (s2pred::CompareEdgeDistance(b, x0, x1, r)) <= (0) ",0x41);
        }
      }
      else {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                   ,0x56d,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)CONCAT62(local_128._10_6_,local_128._8_2_),
                   "Check failed: (s2pred::CompareEdgeDistance(a, x0, x1, r)) <= (0) ",0x41);
      }
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                 ,0x56c,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)CONCAT62(local_128._10_6_,local_128._8_2_),
                 "Check failed: (s2pred::CompareDistances(x0, a, b)) < (0) ",0x39);
    }
  }
  abort();
}

Assistant:

Excluded GetVoronoiSiteExclusion(const S2Point& a, const S2Point& b,
                                 const S2Point& x0, const S2Point& x1,
                                 S1ChordAngle r) {
  S2_DCHECK_LT(r, S1ChordAngle::Right());
  S2_DCHECK_LT(s2pred::CompareDistances(x0, a, b), 0);  // (implies a != b)
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(a, x0, x1, r), 0);
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(b, x0, x1, r), 0);
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactVoronoiSiteExclusion.)
  S2_DCHECK_NE(x0, -x1);

  // If one site is closer than the other to both endpoints of X, then it is
  // closer to every point on X.  Note that this also handles the case where A
  // and B are equidistant from every point on X (i.e., X is the perpendicular
  // bisector of AB), because CompareDistances uses symbolic perturbations to
  // ensure that either A or B is considered closer (in a consistent way).
  // This also ensures that the choice of A or B does not depend on the
  // direction of X.
  if (s2pred::CompareDistances(x1, a, b) < 0) {
    return Excluded::SECOND;  // Site A is closer to every point on X.
  }

  Excluded result = TriageVoronoiSiteExclusion(a, b, x0, x1, r.length2());
  if (result != Excluded::UNCERTAIN) return result;

  result = TriageVoronoiSiteExclusion(ToLD(a), ToLD(b), ToLD(x0), ToLD(x1),
                                      ToLD(r.length2()));
  if (result != Excluded::UNCERTAIN) return result;

  return ExactVoronoiSiteExclusion(ToExact(a), ToExact(b), ToExact(x0),
                                   ToExact(x1), r.length2());
}